

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O3

int opj_getopt(int nargc,char **nargv,char *ostr)

{
  char *pcVar1;
  long lVar2;
  uint __c;
  char cVar3;
  char *pcVar4;
  
  if ((opj_optreset != 0) || (cVar3 = *opj_getopt::place, cVar3 == '\0')) {
    opj_optreset = 0;
    if ((nargc <= opj_optind) || (pcVar4 = nargv[opj_optind], *pcVar4 != '-')) {
LAB_0010d447:
      opj_getopt::place = EMSG;
      opj_optreset = 0;
      return -1;
    }
    cVar3 = pcVar4[1];
    if (cVar3 == '\0') {
      pcVar4 = pcVar4 + 1;
      opj_optopt = 0x2d;
      __c = 0x2d;
      opj_getopt::place = pcVar4;
      pcVar1 = strchr(ostr,0x2d);
      if (pcVar1 == (char *)0x0) {
        return -1;
      }
      goto LAB_0010d4cd;
    }
    if (cVar3 == '-') {
      opj_optind = opj_optind + 1;
      goto LAB_0010d447;
    }
    opj_getopt::place = pcVar4 + 1;
  }
  pcVar4 = opj_getopt::place + 1;
  __c = (uint)cVar3;
  opj_getopt::place = pcVar4;
  opj_optopt = __c;
  if (cVar3 != ':') {
    pcVar1 = strchr(ostr,__c);
    if (pcVar1 != (char *)0x0) {
LAB_0010d4cd:
      if (pcVar1[1] != ':') {
        if (*pcVar4 == '\0') {
          opj_optind = opj_optind + 1;
          opj_optarg = (char *)0x0;
          return __c;
        }
        opj_optarg = (char *)0x0;
        return __c;
      }
      if (*pcVar4 == '\0') {
        lVar2 = (long)opj_optind;
        opj_optind = opj_optind + 1;
        if (opj_optind < nargc) {
          pcVar4 = nargv[lVar2 + 1];
        }
        else {
          opj_getopt::place = EMSG;
          if (*ostr == ':') {
            return 0x3a;
          }
          pcVar4 = opj_optarg;
          if (opj_opterr != 0) {
            fprintf(_stderr,"%s: option requires an argument -- %c\n",*nargv,(ulong)__c);
            return 0x3f;
          }
        }
      }
      opj_optarg = pcVar4;
      opj_getopt::place = EMSG;
      opj_optind = opj_optind + 1;
      return __c;
    }
    if (cVar3 == '-') {
      return -1;
    }
  }
  opj_getopt_cold_1();
  return 0x3f;
}

Assistant:

int opj_getopt(int nargc, char *const *nargv, const char *ostr)
{
#  define __progname nargv[0]
    static char *place = EMSG;    /* option letter processing */
    const char *oli = NULL;   /* option letter list index */

    if (opj_optreset || !*place) {    /* update scanning pointer */
        opj_optreset = 0;
        if (opj_optind >= nargc || *(place = nargv[opj_optind]) != '-') {
            place = EMSG;
            return (-1);
        }
        if (place[1] && *++place == '-') {  /* found "--" */
            ++opj_optind;
            place = EMSG;
            return (-1);
        }
    }             /* option letter okay? */
    if ((opj_optopt = (int) * place++) == (int) ':' ||
            !(oli = strchr(ostr, opj_optopt))) {
        /*
         * if the user didn't specify '-' as an option,
         * assume it means -1.
         */
        if (opj_optopt == (int) '-') {
            return (-1);
        }
        if (!*place) {
            ++opj_optind;
        }
        if (opj_opterr && *ostr != ':') {
            fprintf(stderr,
                    "%s: illegal option -- %c\n", __progname, opj_optopt);
            return (BADCH);
        }
    }
    if (*++oli != ':') {      /* don't need argument */
        opj_optarg = NULL;
        if (!*place) {
            ++opj_optind;
        }
    } else {          /* need an argument */
        if (*place) {       /* no white space */
            opj_optarg = place;
        } else if (nargc <= ++opj_optind) { /* no arg */
            place = EMSG;
            if (*ostr == ':') {
                return (BADARG);
            }
            if (opj_opterr) {
                fprintf(stderr,
                        "%s: option requires an argument -- %c\n",
                        __progname, opj_optopt);
                return (BADCH);
            }
        } else {        /* white space */
            opj_optarg = nargv[opj_optind];
        }
        place = EMSG;
        ++opj_optind;
    }
    return (opj_optopt);      /* dump back option letter */
}